

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::~AnyWriter(AnyWriter *this)

{
  std::
  vector<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
  ::~vector(&this->uninterpreted_events_);
  std::__cxx11::string::~string((string *)&this->data_);
  std::__cxx11::string::~string((string *)&this->type_url_);
  std::
  unique_ptr<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
  ::~unique_ptr(&this->ow_);
  return;
}

Assistant:

ProtoStreamObjectWriter::AnyWriter::~AnyWriter() {}